

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::semaphore::try_release(semaphore *this,long releaseCount)

{
  undefined8 local_18;
  long releaseCount_local;
  semaphore *this_local;
  
  for (local_18 = releaseCount; 0 < local_18; local_18 = local_18 + -1) {
    sem_post((sem_t *)this);
  }
  return;
}

Assistant:

void semaphore::try_release(long releaseCount)
    {
        CRNLIB_ASSERT(releaseCount >= 1);

#ifdef WIN32
        if (1 == releaseCount)
        {
            sem_post(&m_sem);
        }
        else
        {
            sem_post_multiple(&m_sem, releaseCount);
        }
#else
        while (releaseCount > 0)
        {
            sem_post(&m_sem);
            releaseCount--;
        }
#endif
    }